

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.hpp
# Opt level: O0

tuple<czh::utils::DiyFp,_czh::utils::DiyFp> * __thiscall
czh::utils::DiyFp::normalized_boundaries
          (tuple<czh::utils::DiyFp,_czh::utils::DiyFp> *__return_storage_ptr__,DiyFp *this)

{
  uint64_t uVar1;
  long lVar2;
  DiyFp DVar3;
  undefined1 auStack_38 [7];
  bool significand_is_zero;
  DiyFp mi;
  DiyFp pl;
  DiyFp *this_local;
  
  DiyFp((DiyFp *)&mi.e);
  DiyFp((DiyFp *)auStack_38);
  uVar1 = this->f;
  mi._8_8_ = this->f * 2 + 1;
  DVar3 = normalize_boundary((DiyFp *)&mi.e);
  mi._8_8_ = DVar3.f;
  if (uVar1 == 0x10000000000000) {
    lVar2 = this->f * 4;
    mi.f._0_1_ = (char)this->e + -2;
  }
  else {
    lVar2 = this->f * 2;
    mi.f._0_1_ = (char)this->e + -1;
  }
  _auStack_38 = lVar2 - 1;
  _auStack_38 = _auStack_38 << ((char)mi.f - (char)DVar3.e & 0x3fU);
  mi.f._0_4_ = DVar3.e;
  std::tuple<czh::utils::DiyFp,_czh::utils::DiyFp>::
  tuple<czh::utils::DiyFp_&,_czh::utils::DiyFp_&,_true>
            (__return_storage_ptr__,(DiyFp *)auStack_38,(DiyFp *)&mi.e);
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] std::tuple<DiyFp, DiyFp> normalized_boundaries() const
    {
      DiyFp pl, mi;
      bool significand_is_zero = f == DP_HIDDEN_BIT;
      pl.f = (f << 1) + 1;
      pl.e = e - 1;
      pl = pl.normalize_boundary();
      if (significand_is_zero)
      {
        mi.f = (f << 2) - 1;
        mi.e = e - 2;
      }
      else
      {
        mi.f = (f << 1) - 1;
        mi.e = e - 1;
      }
      mi.f <<= mi.e - pl.e;
      mi.e = pl.e;
      return {mi, pl};
    }